

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

int __thiscall uttt::RandomPlayout::operator()(RandomPlayout *this,IBoard *game)

{
  char cVar1;
  short sVar2;
  pointer pcVar3;
  pointer pcVar4;
  result_type_conflict1 rVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  array<short,_9UL> *paVar9;
  param_type local_80;
  vector<long,_std::allocator<long>_> moves;
  long local_58;
  uniform_int_distribution<int> local_50;
  IBoard ngame;
  
  if (operator()(uttt::IBoard_const&)::rd == '\0') {
    iVar6 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd);
    if (iVar6 != 0) {
      std::random_device::random_device(&operator()::rd);
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
    }
  }
  if (operator()(uttt::IBoard_const&)::gen == '\0') {
    iVar6 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen);
    if (iVar6 != 0) {
      uVar7 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&operator()::gen,(ulong)uVar7);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
    }
  }
  ngame.macro = game->macro;
  ngame.micro._M_elems[0] = (game->micro)._M_elems[0];
  ngame.micro._M_elems[1] = (game->micro)._M_elems[1];
  ngame.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
  ngame._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
  cVar1 = g_macro_board_status[ngame.macro];
  iVar6 = -1;
  if (cVar1 != '\0') {
    if (cVar1 == '\x03') {
      iVar6 = 0;
    }
    else {
      iVar6 = (int)cVar1;
    }
  }
  while (iVar6 == -1) {
    lVar8 = (long)ngame.next;
    if (lVar8 < 0) {
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      paVar9 = &ngame.micro;
      for (lVar8 = 0; lVar8 != 0x51; lVar8 = lVar8 + 9) {
        sVar2 = paVar9->_M_elems[0];
        pcVar3 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pcVar3 != pcVar4) {
          local_50._M_param._M_b = ~(uint)pcVar3 + (int)pcVar4;
          local_50._M_param._M_a = 0;
          rVar5 = std::uniform_int_distribution<int>::operator()(&local_50,&operator()::gen);
          local_80 = (param_type)
                     (long)((int)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[rVar5] + (int)lVar8);
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)
                     &moves.super__Vector_base<long,_std::allocator<long>_>,(long *)&local_80);
        }
        paVar9 = (array<short,_9UL> *)(paVar9->_M_elems + 1);
      }
      local_80 = (param_type)
                 ((ulong)((int)((ulong)((long)moves.super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)moves.super__Vector_base<long,_std::allocator<long>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1) <<
                 0x20);
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_80,&operator()::gen);
      local_58 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[rVar5];
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&moves.super__Vector_base<long,_std::allocator<long>_>);
    }
    else {
      sVar2 = ngame.micro._M_elems[lVar8];
      moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)((ulong)(~*(uint *)&g_moves[sVar2].
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                              *(int *)&g_moves[sVar2].
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_finish) << 0x20);
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)
                         &moves.super__Vector_base<long,_std::allocator<long>_>,&operator()::gen);
      local_58 = (long)g_moves[sVar2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start[rVar5] + lVar8 * 9;
    }
    IBoard::ApplyMove(&ngame,&local_58);
    cVar1 = g_macro_board_status[ngame.macro];
    iVar6 = -1;
    if (cVar1 != '\0') {
      if (cVar1 == '\x03') {
        iVar6 = 0;
      }
      else {
        iVar6 = (int)cVar1;
      }
    }
  }
  return iVar6;
}

Assistant:

int
RandomPlayout::operator()(const uttt::IBoard &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        game::IMove m = -1;
        if (ngame.next >= 0)
            m = ngame.next * 9 + g_moves[ngame.micro[ngame.next]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[ngame.next]].size() - 1)(gen)];
        else
        {
            std::vector<game::IMove> moves;
            for (int i = 0; i < 9; i++)
                if (!g_moves[ngame.micro[i]].empty())
                    moves.push_back(i * 9 + g_moves[ngame.micro[i]][std::uniform_int_distribution<>(0, g_moves[ngame.micro[i]].size() - 1)(gen)]);
            m = moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)];
        }
        ngame.ApplyMove(m);
        status = ngame.GetStatus();
    }
    return status;
}